

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O2

void Extra_FileReaderFree(Extra_FileReader_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  
  if ((FILE *)p->pFile != (FILE *)0x0) {
    fclose((FILE *)p->pFile);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  __ptr = p->vTokens;
  free(__ptr->pArray);
  free(__ptr);
  __ptr_00 = p->vLines;
  free(__ptr_00->pArray);
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

void Extra_FileReaderFree( Extra_FileReader_t * p )
{
    if ( p->pFile )
        fclose( p->pFile );
    ABC_FREE( p->pBuffer );
    Vec_PtrFree( p->vTokens );
    Vec_IntFree( p->vLines );
    ABC_FREE( p );
}